

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O0

bool __thiscall
CppUnit::TestPath::splitPathString(TestPath *this,string *pathAsString,PathTestNames *testNames)

{
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar1;
  char *pcVar2;
  value_type local_88;
  value_type local_58;
  int local_34;
  uint local_30;
  int separatorIndex;
  int index;
  bool isRelative;
  PathTestNames *testNames_local;
  string *pathAsString_local;
  TestPath *this_local;
  
  _index = testNames;
  testNames_local = (PathTestNames *)pathAsString;
  pathAsString_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)testNames_local);
    separatorIndex._3_1_ = *pcVar2 != '/';
    local_30 = (uint)!(bool)separatorIndex._3_1_;
    while (local_34 = std::__cxx11::string::find((char)testNames_local,0x2f), this_00 = _index,
          -1 < local_34) {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)testNames_local);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      local_30 = local_34 + 1;
    }
    std::__cxx11::string::substr((ulong)&local_88,(ulong)testNames_local);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    this_local._7_1_ = (bool)(separatorIndex._3_1_ & 1);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
TestPath::splitPathString( const std::string &pathAsString,
                           PathTestNames &testNames )
{
  if ( pathAsString.empty() )
    return true;

  bool isRelative = pathAsString[0] != '/';

  int index = (isRelative ? 0 : 1);
  while ( true )
  {
    int separatorIndex = pathAsString.find( '/', index );
    if ( separatorIndex >= 0 )
    {
      testNames.push_back( pathAsString.substr( index, separatorIndex - index ) );
      index = separatorIndex + 1;
    }
    else
    {
      testNames.push_back( pathAsString.substr( index ) );
      break;
    }
  }

  return isRelative;
}